

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O0

int CfdGetTxInIssuanceInfo
              (void *handle,char *tx_hex_string,uint32_t index,char **entropy,char **nonce,
              int64_t *asset_amount,char **asset_value,int64_t *token_amount,char **token_value,
              char **asset_rangeproof,char **token_rangeproof)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 *in_RCX;
  uint32_t in_EDX;
  char *in_RSI;
  undefined8 *in_R8;
  int64_t *in_R9;
  Amount AVar3;
  undefined8 *in_stack_00000008;
  int64_t *in_stack_00000010;
  undefined8 *in_stack_00000018;
  undefined8 *in_stack_00000020;
  undefined8 *in_stack_00000028;
  CfdException *except;
  exception *std_except;
  ConfidentialValue *token_obj;
  ConfidentialValue *asset_obj;
  ConfidentialTxInReference ref;
  ConfidentialTransaction *tx;
  ConfidentialTransactionController ctxc;
  char *work_token_rangeproof;
  char *work_asset_rangeproof;
  char *work_token_value;
  char *work_asset_value;
  char *work_nonce;
  char *work_entropy;
  ConfidentialTxInReference *in_stack_fffffffffffffa98;
  ConfidentialTxInReference *in_stack_fffffffffffffaa0;
  string *in_stack_fffffffffffffaa8;
  ConfidentialTransactionController *in_stack_fffffffffffffab0;
  undefined8 in_stack_fffffffffffffab8;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffac0;
  int64_t local_528;
  string *in_stack_fffffffffffffb00;
  int64_t local_4f8;
  ByteData local_498;
  string local_480;
  ByteData local_460;
  string local_448;
  string local_428;
  int64_t local_408;
  undefined1 local_400;
  Amount local_3f8;
  string local_3e8;
  string *local_3c8;
  undefined1 local_3c0;
  Amount local_3b8;
  ConfidentialValue local_3a8;
  ConfidentialValue *local_380;
  ConfidentialValue local_378;
  ConfidentialValue *local_350;
  ByteData256 local_348;
  BlindFactor local_330;
  string local_310;
  ByteData256 local_2f0;
  BlindFactor local_2d8;
  string local_2b8;
  ConfidentialTxInReference local_298;
  ConfidentialTransaction *local_138;
  allocator local_129;
  string local_128 [32];
  ConfidentialTransactionController local_108;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  int64_t *local_38;
  undefined8 *local_30;
  undefined8 *local_28;
  uint32_t local_1c;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffab8 >> 0x20);
  local_40 = (char *)0x0;
  local_48 = (char *)0x0;
  local_50 = (char *)0x0;
  local_58 = (char *)0x0;
  local_60 = (char *)0x0;
  local_68 = (char *)0x0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_128,local_18,&local_129);
    cfd::ConfidentialTransactionController::ConfidentialTransactionController
              (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    local_138 = cfd::ConfidentialTransactionController::GetTransaction(&local_108);
    cfd::core::ConfidentialTransaction::GetTxIn(&local_298,local_138,local_1c);
    if (local_28 != (undefined8 *)0x0) {
      cfd::core::ConfidentialTxInReference::GetAssetEntropy(in_stack_fffffffffffffa98);
      cfd::core::BlindFactor::BlindFactor(&local_2d8,&local_2f0);
      cfd::core::BlindFactor::GetHex_abi_cxx11_(&local_2b8,&local_2d8);
      local_40 = cfd::capi::CreateString(in_stack_fffffffffffffb00);
      std::__cxx11::string::~string((string *)&local_2b8);
      cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x5a7d8a);
      cfd::core::ByteData256::~ByteData256((ByteData256 *)0x5a7d97);
    }
    if (local_30 != (undefined8 *)0x0) {
      cfd::core::ConfidentialTxInReference::GetBlindingNonce(in_stack_fffffffffffffa98);
      cfd::core::BlindFactor::BlindFactor(&local_330,&local_348);
      cfd::core::BlindFactor::GetHex_abi_cxx11_(&local_310,&local_330);
      local_48 = cfd::capi::CreateString(in_stack_fffffffffffffb00);
      std::__cxx11::string::~string((string *)&local_310);
      cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x5a7f18);
      cfd::core::ByteData256::~ByteData256((ByteData256 *)0x5a7f25);
    }
    cfd::core::ConfidentialTxInReference::GetIssuanceAmount(in_stack_fffffffffffffa98);
    local_350 = &local_378;
    cfd::core::ConfidentialTxInReference::GetInflationKeys(in_stack_fffffffffffffa98);
    local_380 = &local_3a8;
    if (local_38 != (int64_t *)0x0) {
      bVar1 = cfd::core::ConfidentialValue::HasBlinding(local_350);
      if (!bVar1) {
        bVar1 = cfd::core::ConfidentialValue::HasBlinding(local_350);
        if (bVar1) {
          local_4f8 = 0;
        }
        else {
          AVar3 = cfd::core::ConfidentialValue::GetAmount(local_350);
          in_stack_fffffffffffffb00 = (string *)AVar3.amount_;
          local_3c0 = AVar3.ignore_check_;
          local_3c8 = in_stack_fffffffffffffb00;
          local_3b8.amount_ = (int64_t)in_stack_fffffffffffffb00;
          local_3b8.ignore_check_ = (bool)local_3c0;
          local_4f8 = cfd::core::Amount::GetSatoshiValue(&local_3b8);
        }
        *local_38 = local_4f8;
      }
    }
    if (in_stack_00000008 != (undefined8 *)0x0) {
      cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_3e8,local_350);
      local_50 = cfd::capi::CreateString(in_stack_fffffffffffffb00);
      std::__cxx11::string::~string((string *)&local_3e8);
    }
    if (in_stack_00000010 != (int64_t *)0x0) {
      bVar1 = cfd::core::ConfidentialValue::HasBlinding(local_380);
      if (!bVar1) {
        bVar1 = cfd::core::ConfidentialValue::HasBlinding(local_380);
        if (bVar1) {
          local_528 = 0;
        }
        else {
          AVar3 = cfd::core::ConfidentialValue::GetAmount(local_380);
          local_408 = AVar3.amount_;
          local_400 = AVar3.ignore_check_;
          local_3f8.amount_ = local_408;
          local_3f8.ignore_check_ = (bool)local_400;
          local_528 = cfd::core::Amount::GetSatoshiValue(&local_3f8);
        }
        *in_stack_00000010 = local_528;
      }
    }
    if (in_stack_00000018 != (undefined8 *)0x0) {
      cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_428,local_380);
      local_58 = cfd::capi::CreateString(in_stack_fffffffffffffb00);
      std::__cxx11::string::~string((string *)&local_428);
    }
    if (in_stack_00000020 != (undefined8 *)0x0) {
      cfd::core::ConfidentialTxInReference::GetIssuanceAmountRangeproof(in_stack_fffffffffffffa98);
      cfd::core::ByteData::GetHex_abi_cxx11_(&local_448,&local_460);
      local_60 = cfd::capi::CreateString(in_stack_fffffffffffffb00);
      std::__cxx11::string::~string((string *)&local_448);
      cfd::core::ByteData::~ByteData((ByteData *)0x5a8325);
    }
    if (in_stack_00000028 != (undefined8 *)0x0) {
      cfd::core::ConfidentialTxInReference::GetInflationKeysRangeproof(in_stack_fffffffffffffa98);
      cfd::core::ByteData::GetHex_abi_cxx11_(&local_480,&local_498);
      local_68 = cfd::capi::CreateString(in_stack_fffffffffffffb00);
      std::__cxx11::string::~string((string *)&local_480);
      cfd::core::ByteData::~ByteData((ByteData *)0x5a83e8);
    }
    if (local_40 != (char *)0x0) {
      *local_28 = local_40;
    }
    if (local_48 != (char *)0x0) {
      *local_30 = local_48;
    }
    if (local_50 != (char *)0x0) {
      *in_stack_00000008 = local_50;
    }
    if (local_58 != (char *)0x0) {
      *in_stack_00000018 = local_58;
    }
    if (local_60 != (char *)0x0) {
      *in_stack_00000020 = local_60;
    }
    if (local_68 != (char *)0x0) {
      *in_stack_00000028 = local_68;
    }
    local_4 = 0;
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x5a84ff);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x5a850c);
    cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(in_stack_fffffffffffffaa0);
    cfd::ConfidentialTransactionController::~ConfidentialTransactionController
              ((ConfidentialTransactionController *)in_stack_fffffffffffffaa0);
    return local_4;
  }
  local_90.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
               ,0x2f);
  local_90.filename = local_90.filename + 1;
  local_90.line = 0x259;
  local_90.funcname = "CfdGetTxInIssuanceInfo";
  cfd::core::logger::warn<>(&local_90,"tx is null or empty.");
  local_b2 = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"Failed to parameter. tx is null or empty.",&local_b1);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffac0,error_code,(string *)in_stack_fffffffffffffab0);
  local_b2 = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxInIssuanceInfo(
    void* handle, const char* tx_hex_string, uint32_t index, char** entropy,
    char** nonce, int64_t* asset_amount, char** asset_value,
    int64_t* token_amount, char** token_value, char** asset_rangeproof,
    char** token_rangeproof) {
  char* work_entropy = nullptr;
  char* work_nonce = nullptr;
  char* work_asset_value = nullptr;
  char* work_token_value = nullptr;
  char* work_asset_rangeproof = nullptr;
  char* work_token_rangeproof = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    ConfidentialTransactionController ctxc(tx_hex_string);
    const ConfidentialTransaction& tx = ctxc.GetTransaction();
    const ConfidentialTxInReference ref = tx.GetTxIn(index);

    if (entropy != nullptr) {
      work_entropy = CreateString(BlindFactor(ref.GetAssetEntropy()).GetHex());
    }
    if (nonce != nullptr) {
      work_nonce = CreateString(BlindFactor(ref.GetBlindingNonce()).GetHex());
    }
    const ConfidentialValue& asset_obj = ref.GetIssuanceAmount();
    const ConfidentialValue& token_obj = ref.GetInflationKeys();
    if ((asset_amount != nullptr) && (!asset_obj.HasBlinding())) {
      *asset_amount = (asset_obj.HasBlinding())
                          ? 0
                          : asset_obj.GetAmount().GetSatoshiValue();
    }
    if (asset_value != nullptr) {
      work_asset_value = CreateString(asset_obj.GetHex());
    }
    if ((token_amount != nullptr) && (!token_obj.HasBlinding())) {
      *token_amount = (token_obj.HasBlinding())
                          ? 0
                          : token_obj.GetAmount().GetSatoshiValue();
    }
    if (token_value != nullptr) {
      work_token_value = CreateString(token_obj.GetHex());
    }
    if (asset_rangeproof != nullptr) {
      work_asset_rangeproof =
          CreateString(ref.GetIssuanceAmountRangeproof().GetHex());
    }
    if (token_rangeproof != nullptr) {
      work_token_rangeproof =
          CreateString(ref.GetInflationKeysRangeproof().GetHex());
    }

    if (work_entropy != nullptr) *entropy = work_entropy;
    if (work_nonce != nullptr) *nonce = work_nonce;
    if (work_asset_value != nullptr) *asset_value = work_asset_value;
    if (work_token_value != nullptr) *token_value = work_token_value;
    if (work_asset_rangeproof != nullptr)
      *asset_rangeproof = work_asset_rangeproof;
    if (work_token_rangeproof != nullptr)
      *token_rangeproof = work_token_rangeproof;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(
        &work_entropy, &work_nonce, &work_asset_value, &work_token_value,
        &work_asset_rangeproof, &work_token_rangeproof);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(
        &work_entropy, &work_nonce, &work_asset_value, &work_token_value,
        &work_asset_rangeproof, &work_token_rangeproof);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(
        &work_entropy, &work_nonce, &work_asset_value, &work_token_value,
        &work_asset_rangeproof, &work_token_rangeproof);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}